

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

void __thiscall ON_PolylineCurve::Dump(ON_PolylineCurve *this,ON_TextLog *dump)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int i;
  ulong uVar4;
  long lVar5;
  ON_Interval d;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pdVar3 = ON_Interval::operator[](&d,0);
  dVar1 = *pdVar3;
  pdVar3 = ON_Interval::operator[](&d,1);
  ON_TextLog::Print(dump,"ON_PolylineCurve:  domain = [%g,%g]\n",dVar1,*pdVar3);
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    iVar2 = ON_Polyline::PointCount(&this->m_pline);
    if ((long)iVar2 <= (long)uVar4) break;
    ON_TextLog::Print(dump,"  point[%2d] = ",uVar4 & 0xffffffff);
    ON_TextLog::Print(dump,(ON_3dPoint *)
                           ((long)&((this->m_pline).super_ON_3dPointArray.
                                    super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar5));
    ON_TextLog::Print(dump,", %g\n",(this->m_t).m_a[uVar4]);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x18;
  }
  return;
}

Assistant:

void ON_PolylineCurve::Dump( ON_TextLog& dump ) const
{
  ON_Interval d = Domain();
  dump.Print( "ON_PolylineCurve:  domain = [%g,%g]\n",d[0],d[1]);
  for ( int i = 0; i < PointCount(); i++ ) {
    dump.Print( "  point[%2d] = ",i);
    dump.Print( m_pline[i] );
    dump.Print( ", %g\n",m_t[i]);
  }
}